

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlUnnormalize(Ssw_Sml_t *p)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  lVar6 = (long)p->nWordsFrame;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      puVar1 = (uint *)((long)&p[1].pAig + lVar7 * 4);
      *puVar1 = ~*puVar1;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  pVVar3 = p->pAig->vObjs;
  iVar8 = pVVar3->nSize;
  if (0 < iVar8) {
    ppvVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      pvVar5 = ppvVar4[lVar7];
      if ((((pvVar5 != (void *)0x0) && ((*(ulong *)((long)pvVar5 + 0x18) & 8) != 0)) &&
          (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7)) && (0 < (int)lVar6)) {
        iVar8 = p->nWordsTotal;
        iVar2 = *(int *)((long)pvVar5 + 0x24);
        lVar9 = 0;
        do {
          puVar1 = (uint *)((long)&p[1].pAig + lVar9 * 4 + (long)(iVar8 * iVar2) * 4);
          *puVar1 = ~*puVar1;
          lVar9 = lVar9 + 1;
          lVar6 = (long)p->nWordsFrame;
        } while (lVar9 < lVar6);
        iVar8 = pVVar3->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar8);
  }
  return;
}

Assistant:

void Ssw_SmlUnnormalize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k;
    // convert constant 1
    pSims  = Ssw_ObjSim( p, 0 );
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = ~pSims[i];
    // convert internal nodes
    Aig_ManForEachNode( p->pAig, pObj, k )
    {
        if ( pObj->fPhase == 0 )
            continue;
        pSims  = Ssw_ObjSim( p, pObj->Id );
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims[i];
    }
    // PIs/POs are always stored in their natural state
}